

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

HTS_Boolean
HTS_Model_load(HTS_Model *model,HTS_File *pdf,HTS_File *tree,size_t vector_length,size_t num_windows
              ,HTS_Boolean is_msd)

{
  size_t *psVar1;
  HTS_Question **ppHVar2;
  HTS_Question *pHVar3;
  bool bVar4;
  bool bVar5;
  HTS_Question *pHVar6;
  HTS_Boolean HVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  size_t sVar11;
  HTS_Node *tree_00;
  char *pcVar12;
  char *pcVar13;
  undefined8 *puVar14;
  _HTS_Node *p_Var15;
  _HTS_Node *p_Var16;
  float **ppfVar17;
  float *pfVar18;
  size_t *psVar19;
  HTS_Node **ppHVar20;
  _HTS_Tree **pp_Var21;
  HTS_Node *pHVar22;
  size_t sVar23;
  _HTS_Node *p_Var24;
  ulong uVar25;
  undefined8 *puVar26;
  HTS_Node *pHVar27;
  ulong uVar28;
  HTS_Tree *local_860;
  uint local_838 [256];
  undefined4 local_438;
  
  if ((num_windows == 0 || vector_length == 0) ||
      (pdf == (HTS_File *)0x0 || model == (HTS_Model *)0x0)) {
    return '\0';
  }
  HTS_Model_clear(model);
  psVar1 = &model->ntree;
  if (tree == (HTS_File *)0x0) {
LAB_00154f73:
    *psVar1 = 1;
    sVar23 = 1;
  }
  else {
    *psVar1 = 0;
    iVar8 = HTS_feof(tree);
    if (iVar8 == 0) {
      ppHVar2 = &model->question;
      pHVar22 = (HTS_Node *)0x0;
      local_860 = (HTS_Tree *)0x0;
      do {
        HTS_get_pattern_token(tree,(char *)&local_438);
        if (local_438._2_1_ == '\0' && (short)local_438 == 0x5351) {
          tree_00 = (HTS_Node *)HTS_calloc(1,0x18);
          *(undefined8 *)tree_00 = 0;
          tree_00->pdf = 0;
          tree_00->yes = (_HTS_Node *)0x0;
          HVar7 = HTS_Question_load((HTS_Question *)tree_00,tree);
          if (HVar7 != '\0') {
            ppHVar20 = &local_860->root;
            if (*ppHVar2 == (HTS_Question *)0x0) {
              ppHVar20 = (HTS_Node **)ppHVar2;
            }
            *ppHVar20 = tree_00;
            tree_00->yes = (_HTS_Node *)0x0;
            local_860 = (HTS_Tree *)tree_00;
            goto LAB_001550c7;
          }
LAB_001555f2:
          free(tree_00);
          goto LAB_001555f7;
        }
LAB_001550c7:
        pcVar12 = strchr((char *)&local_438,0x5b);
        if (pcVar12 != (char *)0x0) {
          pcVar13 = strchr(pcVar12 + 1,0x5d);
          if ((pcVar13 != (char *)0x0) && (iVar8 = atoi(pcVar12 + 1), iVar8 != 0)) {
            tree_00 = (HTS_Node *)HTS_calloc(1,0x20);
            tree_00->pdf = 0;
            tree_00->yes = (HTS_Node *)0x0;
            tree_00->no = (_HTS_Node *)(long)iVar8;
            *(undefined8 *)tree_00 = 0;
            pcVar12 = strchr((char *)&local_438,0x7b);
            if (pcVar12 != (char *)0x0) {
              pcVar13 = pcVar12 + 2;
              if (pcVar12[1] != '(') {
                pcVar13 = pcVar12 + 1;
              }
              pcVar12 = strrchr(pcVar13,0x7d);
              if ((pcVar13 < pcVar12) && (pcVar12[-1] == ')')) {
                pcVar12 = pcVar12 + -1;
              }
              *pcVar12 = ',';
              pcVar12 = strchr(pcVar13,0x2c);
              if (pcVar12 != (char *)0x0) {
                puVar26 = (undefined8 *)0x0;
                do {
                  puVar14 = (undefined8 *)HTS_calloc(1,0x10);
                  pHVar27 = (HTS_Node *)(puVar26 + 1);
                  if (*(long *)tree_00 == 0) {
                    pHVar27 = tree_00;
                  }
                  *(undefined8 **)pHVar27 = puVar14;
                  *pcVar12 = '\0';
                  pcVar13 = HTS_strdup(pcVar13);
                  *puVar14 = pcVar13;
                  pcVar13 = pcVar12 + 1;
                  puVar14[1] = 0;
                  pcVar12 = strchr(pcVar13,0x2c);
                  puVar26 = puVar14;
                } while (pcVar12 != (char *)0x0);
              }
            }
            pHVar3 = *ppHVar2;
            HVar7 = HTS_get_pattern_token(tree,(char *)local_838);
            if (HVar7 == '\0') {
LAB_001555e7:
              HTS_Tree_clear((HTS_Tree *)tree_00);
              goto LAB_001555f2;
            }
            p_Var15 = (_HTS_Node *)HTS_calloc(1,0x30);
            p_Var15->index = 0;
            p_Var15->pdf = 0;
            p_Var15->yes = (_HTS_Node *)0x0;
            p_Var15->no = (_HTS_Node *)0x0;
            p_Var15->next = (_HTS_Node *)0x0;
            p_Var15->quest = (HTS_Question *)0x0;
            tree_00->yes = p_Var15;
            if ((short)local_838[0] == 0x7b) {
              while ((HVar7 = HTS_get_pattern_token(tree,(char *)local_838), HVar7 == '\x01' &&
                     ((short)local_838[0] != 0x7d))) {
                uVar9 = atoi((char *)local_838);
                p_Var24 = p_Var15;
                while (p_Var24->index != uVar9) {
                  p_Var24 = p_Var24->next;
                  if (p_Var24 == (_HTS_Node *)0x0) {
                    HTS_error(0,"HTS_Tree_load: Cannot find node %d.\n",(ulong)uVar9);
                    goto LAB_001555e7;
                  }
                }
                HVar7 = HTS_get_pattern_token(tree,(char *)local_838);
                pHVar6 = pHVar3;
                if (HVar7 == '\0') goto LAB_001555e7;
                while( true ) {
                  if (pHVar6 == (HTS_Question *)0x0) {
                    p_Var24->quest = (HTS_Question *)0x0;
                    HTS_error(0,"HTS_Tree_load: Cannot find question %s.\n",local_838);
                    goto LAB_001555e7;
                  }
                  iVar8 = strcmp((char *)local_838,pHVar6->string);
                  if (iVar8 == 0) break;
                  pHVar6 = pHVar6->next;
                }
                p_Var24->quest = pHVar6;
                p_Var16 = (_HTS_Node *)HTS_calloc(1,0x30);
                p_Var24->yes = p_Var16;
                p_Var16 = (_HTS_Node *)HTS_calloc(1,0x30);
                p_Var24->no = p_Var16;
                p_Var16 = p_Var24->yes;
                p_Var16->index = 0;
                p_Var16->pdf = 0;
                p_Var16->yes = (_HTS_Node *)0x0;
                p_Var16->no = (_HTS_Node *)0x0;
                p_Var16->next = (_HTS_Node *)0x0;
                p_Var16->quest = (HTS_Question *)0x0;
                p_Var16 = p_Var24->no;
                p_Var16->index = 0;
                p_Var16->quest = (HTS_Question *)0x0;
                p_Var16->no = (_HTS_Node *)0x0;
                p_Var16->next = (_HTS_Node *)0x0;
                p_Var16->pdf = 0;
                p_Var16->yes = (_HTS_Node *)0x0;
                HVar7 = HTS_get_pattern_token(tree,(char *)local_838);
                if (HVar7 == '\0') {
LAB_00155620:
                  p_Var24->quest = (HTS_Question *)0x0;
                  free(p_Var24->yes);
                  free(p_Var24->no);
                  goto LAB_001555e7;
                }
                HVar7 = HTS_is_num((char *)local_838);
                if (HVar7 == '\0') {
                  sVar23 = HTS_name2num((char *)local_838);
                  p_Var16 = p_Var24->no;
                  p_Var16->pdf = sVar23;
                }
                else {
                  iVar8 = atoi((char *)local_838);
                  p_Var16 = p_Var24->no;
                  p_Var16->index = iVar8;
                }
                p_Var16->next = p_Var15;
                HVar7 = HTS_get_pattern_token(tree,(char *)local_838);
                if (HVar7 == '\0') goto LAB_00155620;
                HVar7 = HTS_is_num((char *)local_838);
                if (HVar7 == '\0') {
                  sVar23 = HTS_name2num((char *)local_838);
                  p_Var15 = p_Var24->yes;
                  p_Var15->pdf = sVar23;
                }
                else {
                  iVar8 = atoi((char *)local_838);
                  p_Var15 = p_Var24->yes;
                  p_Var15->index = iVar8;
                }
                p_Var15->next = p_Var16;
              }
            }
            else {
              sVar23 = HTS_name2num((char *)local_838);
              p_Var15->pdf = sVar23;
            }
            pp_Var21 = (_HTS_Tree **)&pHVar22->pdf;
            if (model->tree == (HTS_Tree *)0x0) {
              pp_Var21 = &model->tree;
            }
            *pp_Var21 = (_HTS_Tree *)tree_00;
            tree_00->pdf = 0;
            *psVar1 = *psVar1 + 1;
            pHVar22 = tree_00;
          }
        }
        iVar8 = HTS_feof(tree);
      } while (iVar8 == 0);
    }
    if (model->tree == (HTS_Tree *)0x0) goto LAB_00154f73;
    sVar23 = *psVar1;
    if (sVar23 == 0) {
      HTS_error(1,"HTS_Model_load_pdf: File for pdfs is not specified.\n");
      goto LAB_001555ff;
    }
  }
  model->vector_length = vector_length;
  model->num_windows = num_windows;
  model->is_msd = is_msd;
  pvVar10 = HTS_calloc(sVar23,8);
  model->npdf = (size_t *)((long)pvVar10 + -0x10);
  sVar23 = model->ntree;
  bVar5 = true;
  bVar4 = true;
  if (1 < sVar23 + 1) {
    uVar25 = 2;
    do {
      sVar11 = HTS_fread_little_endian(local_838,4,1,pdf);
      if (sVar11 != 1) {
        sVar23 = *psVar1;
        uVar28 = sVar23 + 1;
        bVar5 = false;
        bVar4 = false;
        goto LAB_00155441;
      }
      model->npdf[uVar25] = (ulong)local_838[0];
      uVar25 = uVar25 + 1;
      sVar23 = model->ntree;
      uVar28 = sVar23 + 1;
    } while (uVar25 <= uVar28);
    bVar5 = true;
    bVar4 = true;
LAB_00155441:
    if (1 < uVar28) {
      uVar25 = 2;
      do {
        if (model->npdf[uVar25] == 0) {
          HTS_error(1,"HTS_Model_load_pdf: # of pdfs at %d-th state should be positive.\n");
          goto LAB_00155585;
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 <= uVar28);
    }
    if (sVar11 != 1) {
LAB_00155585:
      psVar19 = model->npdf;
      model->npdf = psVar19 + 2;
      free(psVar19 + 2);
      model->vector_length = 0;
      model->num_windows = 0;
      model->is_msd = '\0';
      model->pdf = (float ***)0x0;
      model->tree = (HTS_Tree *)0x0;
      *psVar1 = 0;
      model->npdf = (size_t *)0x0;
      model->question = (HTS_Question *)0x0;
      goto LAB_001555ff;
    }
  }
  pvVar10 = HTS_calloc(sVar23,8);
  model->pdf = (float ***)((long)pvVar10 + -0x10);
  if (1 < model->ntree + 1) {
    sVar23 = (ulong)(is_msd != '\0') + model->vector_length * model->num_windows * 2;
    psVar19 = model->npdf;
    uVar25 = 2;
    do {
      ppfVar17 = (float **)HTS_calloc(psVar19[uVar25],8);
      model->pdf[uVar25] = ppfVar17;
      model->pdf[uVar25] = model->pdf[uVar25] + -1;
      psVar19 = model->npdf;
      if (psVar19[uVar25] != 0) {
        uVar28 = 1;
        bVar4 = bVar5;
        do {
          pfVar18 = (float *)HTS_calloc(sVar23,4);
          model->pdf[uVar25][uVar28] = pfVar18;
          sVar11 = HTS_fread_little_endian(model->pdf[uVar25][uVar28],4,sVar23,pdf);
          if (sVar11 != sVar23) {
            bVar4 = false;
          }
          uVar28 = uVar28 + 1;
          psVar19 = model->npdf;
          bVar5 = bVar4;
        } while (uVar28 <= psVar19[uVar25]);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 <= *psVar1 + 1);
  }
  if (bVar4) {
    return '\x01';
  }
LAB_001555f7:
  HTS_Model_clear(model);
LAB_001555ff:
  HTS_Model_clear(model);
  return '\0';
}

Assistant:

static HTS_Boolean HTS_Model_load(HTS_Model * model, HTS_File * pdf, HTS_File * tree, size_t vector_length, size_t num_windows, HTS_Boolean is_msd)
{
   /* check */
   if (model == NULL || pdf == NULL || vector_length == 0 || num_windows == 0)
      return FALSE;

   /* reset */
   HTS_Model_clear(model);

   /* load tree */
   if (HTS_Model_load_tree(model, tree) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   /* load pdf */
   if (HTS_Model_load_pdf(model, pdf, vector_length, num_windows, is_msd) != TRUE) {
      HTS_Model_clear(model);
      return FALSE;
   }

   return TRUE;
}